

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O1

int __thiscall Fl_Tree::draw_tree(Fl_Tree *this)

{
  Fl_Scrollbar *pFVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  Fl_Tree_Item *itemfocus;
  int iVar12;
  int iVar13;
  uint uVar14;
  int Y;
  
  fix_scrollbar_order(this);
  iVar13 = (this->super_Fl_Group).super_Fl_Widget.x_;
  iVar2 = Fl::box_dx((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  iVar10 = (this->super_Fl_Group).super_Fl_Widget.y_;
  iVar3 = Fl::box_dy((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  iVar12 = (this->super_Fl_Group).super_Fl_Widget.w_;
  iVar4 = Fl::box_dw((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  iVar11 = (this->super_Fl_Group).super_Fl_Widget.h_;
  iVar5 = Fl::box_dh((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  if (1 < (this->super_Fl_Group).super_Fl_Widget.damage_) {
    Fl_Widget::draw_box((Fl_Widget *)this);
    Fl_Widget::draw_label((Fl_Widget *)this);
  }
  if (this->_root == (Fl_Tree_Item *)0x0) {
    iVar13 = 0;
  }
  else {
    uVar9 = iVar2 + iVar13;
    uVar8 = iVar3 + iVar10;
    uVar14 = iVar12 - iVar4;
    iVar13 = (this->_prefs)._marginleft;
    iVar10 = 0;
    if (((this->_vscroll->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0) {
      iVar10 = (int)(this->_vscroll->super_Fl_Slider).super_Fl_Valuator.value_;
    }
    iVar10 = ((this->_prefs)._margintop + uVar8) - iVar10;
    iVar11 = iVar11 - iVar5;
    iVar12 = uVar14 - iVar13;
    iVar13 = iVar13 + uVar9;
    if ((this->_prefs)._connectorstyle == FL_TREE_CONNECTOR_NONE) {
      iVar2 = ((this->_prefs)._openimage)->w_;
      iVar13 = iVar13 - iVar2;
      iVar12 = iVar12 + iVar2;
    }
    Y = iVar10;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
              (fl_graphics_driver,(ulong)uVar9,(ulong)uVar8,(ulong)uVar14);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
              (fl_graphics_driver,(ulong)(uint)(this->_prefs)._labelfont,
               (ulong)(uint)(this->_prefs)._labelsize);
    if ((Fl_Tree *)Fl::focus_ == this) {
      itemfocus = this->_item_focus;
    }
    else {
      itemfocus = (Fl_Tree_Item *)0x0;
    }
    Fl_Tree_Item::draw(this->_root,iVar13,&Y,iVar12,(Fl_Widget *)this,itemfocus,&this->_prefs,1);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
    iVar13 = (iVar11 + uVar8) - Y;
    iVar12 = 0;
    if (0 < iVar13) {
      iVar12 = iVar13;
    }
    iVar12 = (Y - iVar10) + (this->_prefs)._margintop + iVar12;
    if (((iVar10 < (int)uVar8) || (iVar11 < iVar12)) ||
       (1 < (int)(this->_vscroll->super_Fl_Slider).super_Fl_Valuator.value_)) {
      uVar8 = this->_scrollbar_size;
      if (uVar8 == 0) {
        uVar8 = Fl::scrollbar_size();
      }
      iVar10 = (this->super_Fl_Group).super_Fl_Widget.x_;
      iVar2 = (this->super_Fl_Group).super_Fl_Widget.w_;
      iVar5 = Fl::box_dx((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
      iVar3 = (this->super_Fl_Group).super_Fl_Widget.y_;
      iVar6 = Fl::box_dy((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
      iVar4 = (this->super_Fl_Group).super_Fl_Widget.h_;
      iVar7 = Fl::box_dh((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
      (*(this->_vscroll->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget[5])();
      (*(this->_vscroll->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget[4])
                (this->_vscroll,(ulong)((iVar10 + iVar2) - (iVar5 + uVar8)),
                 (ulong)(uint)(iVar3 + iVar6),(ulong)uVar8,(ulong)(uint)(iVar4 - iVar7));
      Fl_Slider::slider_size
                (&this->_vscroll->super_Fl_Slider,(double)((float)iVar11 / (float)iVar12));
      pFVar1 = this->_vscroll;
      (pFVar1->super_Fl_Slider).super_Fl_Valuator.min = 0.0;
      (pFVar1->super_Fl_Slider).super_Fl_Valuator.max = (double)(iVar12 - iVar11);
    }
    else {
      Fl_Valuator::value((Fl_Valuator *)this->_vscroll,0.0);
      (*(this->_vscroll->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget[6])();
      iVar13 = 0;
    }
    Fl_Group::draw_child(&this->super_Fl_Group,(Fl_Widget *)this->_vscroll);
  }
  return iVar13;
}

Assistant:

int Fl_Tree::draw_tree() {
  int ret = 0;
  fix_scrollbar_order();
  // Let group draw box+label but *NOT* children.
  // We handle drawing children ourselves by calling each item's draw()
  //
  int cx = x() + Fl::box_dx(box());
  int cy = y() + Fl::box_dy(box());
  int cw = w() - Fl::box_dw(box());
  int ch = h() - Fl::box_dh(box());
  {
    // Handle group's bg
    if ( damage() & ~FL_DAMAGE_CHILD) {			// redraw entire widget?
      Fl_Group::draw_box();
      Fl_Group::draw_label();
    }
    if ( ! _root ) return(0);
    // These values are changed during drawing
    // By end, 'Y' will be the lowest point on the tree
    int X = cx + _prefs.marginleft();
    int Y = cy + _prefs.margintop() - (_vscroll->visible() ? _vscroll->value() : 0);
    int W = cw - _prefs.marginleft();			// - _prefs.marginright();
    // Adjust root's X/W if connectors off
    if (_prefs.connectorstyle() == FL_TREE_CONNECTOR_NONE) {
      X -= _prefs.openicon()->w();
      W += _prefs.openicon()->w();
    }
    int Ysave = Y;
    fl_push_clip(cx,cy,cw,ch);
    {
      fl_font(_prefs.labelfont(), _prefs.labelsize());
      _root->draw(X, Y, W, this,
		  (Fl::focus()==this)?_item_focus:0,	// show focus item ONLY if Fl_Tree has focus
		  _prefs);
    }
    fl_pop_clip();
    
    // Show vertical scrollbar?
    {
#if FLTK_ABI_VERSION >= 10301
      // NEW
      int SY = Y + _prefs.marginbottom();
#else /*FLTK_ABI_VERSION*/
      // OLD
      int SY = Y;
#endif /*FLTK_ABI_VERSION*/
      int ydiff = (SY+_prefs.margintop())-Ysave;		// ydiff=size of tree
      int ytoofar = (cy+ch) - SY;				// ytoofar -- if >0, scrolled beyond bottom
      if ( ytoofar > 0 ) ydiff += ytoofar;
      if ( Ysave<cy || ydiff>ch || int(_vscroll->value())>1 ) {
	_vscroll->visible();
	int scrollsize = _scrollbar_size ? _scrollbar_size : Fl::scrollbar_size();
	int sx = x()+w()-Fl::box_dx(box())-scrollsize;
	int sy = y()+Fl::box_dy(box());
	int sw = scrollsize;
	int sh = h()-Fl::box_dh(box());
	_vscroll->show();
	_vscroll->resize(sx,sy,sw,sh);
	_vscroll->slider_size(float(ch)/float(ydiff));
	_vscroll->range(0.0,ydiff-ch);
	ret = ytoofar;
      } else {
	_vscroll->Fl_Slider::value(0);
	_vscroll->hide();
	ret = 0;
      }
    }
  }
  draw_child(*_vscroll);	// draw scroll last
  return(ret);
}